

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall
t_go_generator::generate_go_struct_initializer
          (t_go_generator *this,ostream *out,t_struct *tstruct,bool is_args_or_result)

{
  t_field *tfield;
  bool bVar1;
  ostream *poVar2;
  pointer pptVar3;
  string publicized_name;
  t_const_value *def_value;
  string local_a0;
  pointer local_80;
  t_const_value *local_78;
  string local_70;
  string local_50;
  
  type_name_abi_cxx11_(&local_70,this,&tstruct->super_t_type);
  publicize(&local_a0,this,&local_70,is_args_or_result);
  poVar2 = std::operator<<(out,(string *)&local_a0);
  std::operator<<(poVar2,"{");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  local_80 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; pptVar3 != local_80;
      pptVar3 = pptVar3 + 1) {
    tfield = *pptVar3;
    bVar1 = is_pointer_field(tfield,false);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    get_publicized_name_and_def_value(this,tfield,&local_a0,&local_78);
    if (!bVar1 && local_78 != (t_const_value *)0x0) {
      bVar1 = omit_initialization(tfield);
      if (!bVar1) {
        poVar2 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
        poVar2 = std::operator<<(poVar2,(string *)&local_70);
        poVar2 = std::operator<<(poVar2,(string *)&local_a0);
        poVar2 = std::operator<<(poVar2,": ");
        render_field_initial_value(&local_50,this,tfield,&tfield->name_,false);
        poVar2 = std::operator<<(poVar2,(string *)&local_50);
        poVar2 = std::operator<<(poVar2,",");
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    std::__cxx11::string::~string((string *)&local_a0);
  }
  poVar2 = std::operator<<(out,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_go_generator::generate_go_struct_initializer(ostream& out,
                                                    t_struct* tstruct,
                                                    bool is_args_or_result) {
  out << publicize(type_name(tstruct), is_args_or_result) << "{";
  const vector<t_field*>& members = tstruct->get_members();
  for (auto member : members) {
    bool pointer_field = is_pointer_field(member);
    string publicized_name;
    t_const_value* def_value;
    get_publicized_name_and_def_value(member, &publicized_name, &def_value);
    if (!pointer_field && def_value != nullptr && !omit_initialization(member)) {
      out << endl << indent() << publicized_name << ": "
          << render_field_initial_value(member, member->get_name(), pointer_field) << ","
          << endl;
    }
  }

  out << "}" << endl;
}